

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validation_state.cpp
# Opt level: O1

void __thiscall
spvtools::val::ValidationState_t::ComputeRecursiveEntryPoints(ValidationState_t *this)

{
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> *this_00;
  _Rb_tree_header *p_Var1;
  pointer puVar2;
  _Rb_tree_node_base *p_Var3;
  Function *pFVar4;
  mapped_type *pmVar5;
  pointer pFVar6;
  pointer puVar7;
  pair<std::_Rb_tree_iterator<unsigned_int>,_bool> pVar8;
  uint32_t new_call;
  uint32_t new_call_1;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> call_stack;
  uint32_t entry_point;
  set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_> visited;
  _Rb_tree_color local_108;
  _Rb_tree_color local_104;
  pointer local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  _Rb_tree_color *local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  _Rb_tree_color *local_c8;
  _Rb_tree_color *p_Stack_c0;
  _Rb_tree_color *local_b8;
  long lStack_b0;
  _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
  *local_a8;
  ValidationState_t *local_a0;
  pointer local_98;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_90;
  _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
  local_60;
  
  pFVar6 = (this->module_functions_).
           super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
           _M_impl.super__Vector_impl_data._M_start;
  local_98 = (this->module_functions_).
             super__Vector_base<spvtools::val::Function,_std::allocator<spvtools::val::Function>_>.
             _M_impl.super__Vector_impl_data._M_finish;
  if (pFVar6 != local_98) {
    p_Var1 = &local_90._M_impl.super__Rb_tree_header;
    local_a8 = (_Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                *)&this->function_to_entry_points_;
    this_00 = &this->recursive_entry_points_;
    local_a0 = this;
    do {
      local_b8 = (_Rb_tree_color *)0x0;
      lStack_b0 = 0;
      local_c8 = (_Rb_tree_color *)0x0;
      p_Stack_c0 = (_Rb_tree_color *)0x0;
      local_d8 = 0;
      uStack_d0 = 0;
      local_e8 = (_Rb_tree_color *)0x0;
      uStack_e0 = 0;
      local_f8 = 0;
      uStack_f0 = 0;
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::_M_initialize_map
                ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8,0);
      local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      local_60._M_impl.super__Rb_tree_header._M_header._M_left =
           &local_60._M_impl.super__Rb_tree_header._M_header;
      local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_100 = pFVar6;
      local_60._M_impl.super__Rb_tree_header._M_header._M_right =
           local_60._M_impl.super__Rb_tree_header._M_header._M_left;
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_Rb_tree(&local_90,&(pFVar6->function_call_targets_)._M_t);
      for (p_Var3 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var3 != p_Var1;
          p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
        local_108 = p_Var3[1]._M_color;
        if (local_c8 == local_b8 + -1) {
          std::deque<unsigned_int,std::allocator<unsigned_int>>::
          _M_push_back_aux<unsigned_int_const&>
                    ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,&local_108);
        }
        else {
          *local_c8 = local_108;
          local_c8 = local_c8 + 1;
        }
      }
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase(&local_90,(_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
      if (local_c8 != local_e8) {
LAB_006b2a32:
        if (local_c8 == p_Stack_c0) {
          local_108 = *(_Rb_tree_color *)(*(long *)(lStack_b0 + -8) + 0x1fc);
          operator_delete(p_Stack_c0,0x200);
          p_Stack_c0 = *(_Rb_tree_color **)(lStack_b0 + -8);
          local_b8 = p_Stack_c0 + 0x80;
          local_c8 = p_Stack_c0 + 0x7f;
          lStack_b0 = lStack_b0 + -8;
        }
        else {
          local_108 = local_c8[-1];
          local_c8 = local_c8 + -1;
        }
        pVar8 = std::
                _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                ::_M_insert_unique<unsigned_int_const&>
                          ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                            *)&local_60,&local_108);
        if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
        goto LAB_006b2b41;
        if (local_108 != local_100->id_) {
          pFVar4 = function(this,local_108);
          if (pFVar4 != (Function *)0x0) {
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_Rb_tree(&local_90,&(pFVar4->function_call_targets_)._M_t);
            for (p_Var3 = local_90._M_impl.super__Rb_tree_header._M_header._M_left;
                (_Rb_tree_header *)p_Var3 != p_Var1;
                p_Var3 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3)) {
              local_104 = p_Var3[1]._M_color;
              if (local_c8 == local_b8 + -1) {
                std::deque<unsigned_int,std::allocator<unsigned_int>>::
                _M_push_back_aux<unsigned_int_const&>
                          ((deque<unsigned_int,std::allocator<unsigned_int>> *)&local_f8,&local_104)
                ;
              }
              else {
                *local_c8 = local_104;
                local_c8 = local_c8 + 1;
              }
            }
            std::
            _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
            ::_M_erase(&local_90,
                       (_Link_type)local_90._M_impl.super__Rb_tree_header._M_header._M_parent);
          }
          goto LAB_006b2b41;
        }
        pmVar5 = std::__detail::
                 _Map_base<unsigned_int,_std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[](local_a8,&local_108);
        puVar2 = (pmVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        this = local_a0;
        for (puVar7 = (pmVar5->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                      _M_impl.super__Vector_impl_data._M_start; local_a0 = this, puVar7 != puVar2;
            puVar7 = puVar7 + 1) {
          local_90._M_impl._0_4_ = *puVar7;
          std::
          _Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
          ::_M_insert_unique<unsigned_int_const&>
                    ((_Rb_tree<unsigned_int,unsigned_int,std::_Identity<unsigned_int>,std::less<unsigned_int>,std::allocator<unsigned_int>>
                      *)this_00,(uint *)&local_90);
          this = local_a0;
        }
      }
LAB_006b2b9b:
      std::
      _Rb_tree<unsigned_int,_unsigned_int,_std::_Identity<unsigned_int>,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>
      ::_M_erase(&local_60,(_Link_type)local_60._M_impl.super__Rb_tree_header._M_header._M_parent);
      std::_Deque_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Deque_base
                ((_Deque_base<unsigned_int,_std::allocator<unsigned_int>_> *)&local_f8);
      pFVar6 = local_100 + 1;
    } while (pFVar6 != local_98);
  }
  return;
LAB_006b2b41:
  if (local_c8 == local_e8) goto LAB_006b2b9b;
  goto LAB_006b2a32;
}

Assistant:

bool ValidationState_t::IsIntVectorType(uint32_t id) const {
  const Instruction* inst = FindDef(id);
  if (!inst) {
    return false;
  }

  if (inst->opcode() == spv::Op::OpTypeVector) {
    return IsIntScalarType(GetComponentType(id));
  }

  return false;
}